

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

int CfdHash256(void *handle,char *message,bool has_text,char **output)

{
  size_t sVar1;
  char *pcVar2;
  CfdException *pCVar3;
  ByteData256 data;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  ByteData256 local_78;
  ByteData256 local_60;
  ByteData local_48;
  
  cfd::Initialize();
  if (message == (char *)0x0) {
    local_98._0_8_ = "cfdcapi_common.cpp";
    local_98._8_4_ = 0x432;
    local_88._M_allocated_capacity = 0x62c64c;
    cfd::core::logger::log<>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"message is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Failed to parameter. message is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (output == (char **)0x0) {
    local_98._0_8_ = "cfdcapi_common.cpp";
    local_98._8_4_ = 0x438;
    local_88._M_allocated_capacity = 0x62c64c;
    cfd::core::logger::log<>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Failed to parameter. output is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::ByteData256::ByteData256(&local_60);
  local_98._0_8_ = &local_88;
  if (has_text) {
    sVar1 = strlen(message);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,message,message + sVar1);
    cfd::core::HashUtil::Sha256D(&local_78,(string *)local_98);
    cfd::core::ByteData256::operator=(&local_60,&local_78);
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    sVar1 = strlen(message);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,message,message + sVar1);
    cfd::core::ByteData::ByteData(&local_48,(string *)local_98);
    cfd::core::HashUtil::Sha256D(&local_78,&local_48);
    cfd::core::ByteData256::operator=(&local_60,&local_78);
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &local_88) {
    operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_98,&local_60);
  pcVar2 = cfd::capi::CreateString((string *)local_98);
  *output = pcVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &local_88) {
    operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
  }
  if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdHash256(
    void* handle, const char* message, bool has_text, char** output) {
  try {
    cfd::Initialize();
    if (message == nullptr) {
      warn(CFD_LOG_SOURCE, "message is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. message is null.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }

    cfd::core::ByteData256 data;
    if (has_text) {
      data = cfd::core::HashUtil::Sha256D(std::string(message));
    } else {
      data = cfd::core::HashUtil::Sha256D(ByteData(message));
    }
    *output = cfd::capi::CreateString(data.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}